

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MFIter.cpp
# Opt level: O3

void __thiscall amrex::MFIter::Initialize(MFIter *this)

{
  int iVar1;
  FabArrayBase *this_00;
  TileArray *pTVar2;
  long lVar3;
  undefined4 uVar4;
  long lVar5;
  bool bVar6;
  
  iVar1 = depth + 1;
  bVar6 = depth != 0;
  depth = iVar1;
  if ((bVar6) && (allow_multiple_mfiters == 0)) {
    Assert_host("depth == 1 || MFIter::allow_multiple_mfiters",
                "/workspace/llm4binary/github/license_c_cmakelists/AMReX-Combustion[P]PeleLM/Submodules/amrex/Src/Base/AMReX_MFIter.cpp"
                ,0xfb,
                "\"Nested or multiple active MFIters is not supported by default.  This can be changed by calling MFIter::allowMultipleMFIters(true)\"."
               );
  }
  this_00 = this->fabArray;
  if ((this->flags & 2) == 0) {
    pTVar2 = FabArrayBase::getTileArray(this_00,&this->tile_size);
    this->index_map = &pTVar2->indexMap;
    this->local_index_map = &pTVar2->localIndexMap;
    this->tile_array = &pTVar2->tileArray;
    this->local_tile_index_map = &pTVar2->localTileIndexMap;
    this->num_local_tiles = &pTVar2->numLocalTiles;
    this->endIndex =
         (int)((ulong)((long)(pTVar2->indexMap).super_vector<int,_std::allocator<int>_>.
                             super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_finish -
                      (long)(pTVar2->indexMap).super_vector<int,_std::allocator<int>_>.
                            super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start) >> 2);
    this->currentIndex = 0;
    this->beginIndex = 0;
    lVar3 = 0x30;
    lVar5 = 0xc;
    uVar4 = 0;
    switch((this->fabArray->boxarray).m_bat.m_bat_type) {
    case null:
    case coarsenRatio:
      break;
    default:
      lVar5 = 0x10;
    case indexType:
    case indexType_coarsenRatio:
      uVar4 = *(undefined4 *)((long)&this->fabArray->_vptr_FabArrayBase + lVar5);
    }
  }
  else {
    this->index_map = &this_00->indexArray;
    this->currentIndex = 0;
    this->beginIndex = 0;
    uVar4 = (undefined4)
            ((ulong)((long)(this_00->indexArray).super_vector<int,_std::allocator<int>_>.
                           super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                    (long)(this_00->indexArray).super_vector<int,_std::allocator<int>_>.
                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start) >> 2);
    lVar3 = 0x28;
  }
  *(undefined4 *)((long)(this->tile_size).vect + lVar3 + -0x10) = uVar4;
  return;
}

Assistant:

void
MFIter::Initialize ()
{
#ifdef AMREX_USE_OMP
#pragma omp master
#endif
    {
        ++depth;
        AMREX_ALWAYS_ASSERT_WITH_MESSAGE(depth == 1 || MFIter::allow_multiple_mfiters,
            "Nested or multiple active MFIters is not supported by default.  This can be changed by calling MFIter::allowMultipleMFIters(true)".);
    }

#ifdef AMREX_USE_GPU
    if (device_sync) {
#ifdef AMREX_USE_OMP
#pragma omp single
#endif
        Gpu::streamSynchronize();
    }
#endif

    if (flags & AllBoxes)  // a very special case
    {
        index_map    = &(fabArray.IndexArray());
        currentIndex = 0;
        beginIndex   = 0;
        endIndex     = index_map->size();
    }
    else
    {
        const FabArrayBase::TileArray* pta = fabArray.getTileArray(tile_size);

        index_map            = &(pta->indexMap);
        local_index_map      = &(pta->localIndexMap);
        tile_array           = &(pta->tileArray);
        local_tile_index_map = &(pta->localTileIndexMap);
        num_local_tiles      = &(pta->numLocalTiles);

        {
            int rit = 0;
            int nworkers = 1;
#ifdef BL_USE_TEAM
            if (ParallelDescriptor::TeamSize() > 1) {
                if ( tile_size == IntVect::TheZeroVector() ) {
                    // In this case the TileArray contains only boxes owned by this worker.
                    // So there is no sharing going on.
                    rit = 0;
                    nworkers = 1;
                } else {
                    rit = ParallelDescriptor::MyRankInTeam();
                    nworkers = ParallelDescriptor::TeamSize();
                }
            }
#endif

            int ntot = index_map->size();

            if (nworkers == 1)
            {
                beginIndex = 0;
                endIndex = ntot;
            }
            else
            {
                int nr   = ntot / nworkers;
                int nlft = ntot - nr * nworkers;
                if (rit < nlft) {  // get nr+1 items
                    beginIndex = rit * (nr + 1);
                    endIndex = beginIndex + nr + 1;
                } else {           // get nr items
                    beginIndex = rit * nr + nlft;
                    endIndex = beginIndex + nr;
                }
            }
        }

#ifdef AMREX_USE_OMP
        int nthreads = omp_get_num_threads();
        if (nthreads > 1)
        {
            if (dynamic)
            {
                beginIndex = omp_get_thread_num();
            }
            else
            {
                int tid = omp_get_thread_num();
                int ntot = endIndex - beginIndex;
                int nr   = ntot / nthreads;
                int nlft = ntot - nr * nthreads;
                if (tid < nlft) {  // get nr+1 items
                    beginIndex += tid * (nr + 1);
                    endIndex = beginIndex + nr + 1;
                } else {           // get nr items
                    beginIndex += tid * nr + nlft;
                    endIndex = beginIndex + nr;
                }
            }
        }
#endif

        currentIndex = beginIndex;

#ifdef AMREX_USE_GPU
        Gpu::Device::setStreamIndex((streams > 0) ? currentIndex%streams : -1);
#endif

        typ = fabArray.boxArray().ixType();
    }
}